

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O2

int ffmbyt(fitsfile *fptr,LONGLONG bytepos,int err_mode,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  
  if (0 < *status) {
    return *status;
  }
  if (bytepos < 0) {
    *status = 0x130;
    iVar1 = 0x130;
  }
  else {
    pFVar2 = fptr->Fptr;
    if (fptr->HDUposition != pFVar2->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      pFVar2 = fptr->Fptr;
    }
    if (((long)pFVar2->curbuf < 0) || ((ulong)bytepos / 0xb40 != pFVar2->bufrecnum[pFVar2->curbuf]))
    {
      ffldrc(fptr,(ulong)bytepos / 0xb40,err_mode,status);
    }
    iVar1 = *status;
    if (iVar1 < 1) {
      fptr->Fptr->bytepos = bytepos;
    }
  }
  return iVar1;
}

Assistant:

int ffmbyt(fitsfile *fptr,    /* I - FITS file pointer                */
           LONGLONG bytepos,     /* I - byte position in file to move to */
           int err_mode,      /* I - 1=ignore error, 0 = return error */
           int *status)       /* IO - error status                    */
{
/*
  Move to the input byte location in the file.  When writing to a file, a move
  may sometimes be made to a position beyond the current EOF.  The err_mode
  parameter determines whether such conditions should be returned as an error
  or simply ignored.
*/
    long record;

    if (*status > 0)
       return(*status);

    if (bytepos < 0)
        return(*status = NEG_FILE_POS);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    record = (long) (bytepos / IOBUFLEN);  /* zero-indexed record number */

    /* if this is not the current record, then load it */
    if ( ((fptr->Fptr)->curbuf < 0) || 
         (record != (fptr->Fptr)->bufrecnum[(fptr->Fptr)->curbuf])) 
        ffldrc(fptr, record, err_mode, status);

    if (*status <= 0)
        (fptr->Fptr)->bytepos = bytepos;  /* save new file position */

    return(*status);
}